

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

Result __thiscall wabt::interp::Table::Grow(Table *this,Store *store,u32 count,Ref ref)

{
  Limits *pLVar1;
  ulong uVar2;
  u32 offset;
  bool bVar3;
  Enum EVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar6 = (ulong)count;
  bVar3 = Store::HasValueType(store,ref,*(ValueType *)&(this->type_).super_ExternType.field_0xc);
  if (bVar3) {
    uVar2 = (this->type_).limits.max;
    EVar4 = Error;
    if ((uVar6 <= uVar2) &&
       (uVar5 = (ulong)((long)(this->elements_).
                              super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->elements_).
                             super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3,
       (uVar5 & 0xffffffff) <= uVar2 - uVar6)) {
      offset = (u32)uVar5;
      pLVar1 = &(this->type_).limits;
      pLVar1->initial = pLVar1->initial + uVar6;
      std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::resize
                (&this->elements_,(ulong)(count + offset));
      Fill(this,store,offset,ref,count);
      EVar4 = Ok;
    }
    return (Result)EVar4;
  }
  __assert_fail("store.HasValueType(ref, type_.element)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/interp.cc"
                ,0x209,"Result wabt::interp::Table::Grow(Store &, u32, Ref)");
}

Assistant:

Result Table::Grow(Store& store, u32 count, Ref ref) {
  size_t old_size = elements_.size();
  u32 new_size;
  assert(store.HasValueType(ref, type_.element));
  if (CanGrow<u32>(type_.limits, old_size, count, &new_size)) {
    // Grow the limits of the table too, so that if it is used as an
    // import to another module its new size is honored.
    type_.limits.initial += count;
    elements_.resize(new_size);
    Fill(store, old_size, ref, new_size - old_size);
    return Result::Ok;
  }
  return Result::Error;
}